

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyfiledialogs.c
# Opt level: O0

int pythonDbusPresent(void)

{
  int iVar1;
  char *pcVar2;
  char lPythonParams [256];
  char lPythonCommand [384];
  bool local_28a;
  byte local_289;
  undefined1 local_288 [256];
  char local_188 [392];
  
  memcpy(local_288,
         "-c \"try:\n\timport dbus;bus=dbus.SessionBus();notif=bus.get_object(\'org.freedesktop.Notifications\',\'/org/freedesktop/Notifications\');notify=dbus.Interface(notif,\'org.freedesktop.Notifications\');\nexcept:\n\tprint(0);\""
         ,0x100);
  if (pythonDbusPresent::lPythonDbusPresent < 0) {
    pythonDbusPresent::lPythonDbusPresent = 0;
    iVar1 = python2Present();
    if (iVar1 != 0) {
      strcpy(gPythonName,gPython2Name);
      sprintf(local_188,"%s %s",gPythonName,local_288);
      pythonDbusPresent::lPythonDbusPresent = tryCommand((char *)lPythonCommand._104_8_);
    }
    if ((pythonDbusPresent::lPythonDbusPresent == 0) && (iVar1 = python3Present(), iVar1 != 0)) {
      strcpy(gPythonName,gPython3Name);
      sprintf(local_188,"%s %s",gPythonName,local_288);
      pythonDbusPresent::lPythonDbusPresent = tryCommand((char *)lPythonCommand._104_8_);
    }
    if (tinyfd_verbose != 0) {
      printf("lPythonDbusPresent %d\n",(ulong)(uint)pythonDbusPresent::lPythonDbusPresent);
    }
    if (tinyfd_verbose != 0) {
      printf("gPythonName %s\n",gPythonName);
    }
  }
  local_289 = 0;
  if (pythonDbusPresent::lPythonDbusPresent != 0) {
    iVar1 = graphicMode();
    local_289 = 0;
    if (iVar1 != 0) {
      iVar1 = tfd_isDarwin();
      local_28a = false;
      if (iVar1 != 0) {
        pcVar2 = getenv("SSH_TTY");
        local_28a = pcVar2 != (char *)0x0;
      }
      local_289 = local_28a ^ 0xff;
    }
  }
  return (int)(local_289 & 1);
}

Assistant:

static int pythonDbusPresent(void)
{
    static int lPythonDbusPresent = -1 ;
        char lPythonCommand[384];
        char lPythonParams[256] =
"-c \"try:\n\timport dbus;bus=dbus.SessionBus();\
notif=bus.get_object('org.freedesktop.Notifications','/org/freedesktop/Notifications');\
notify=dbus.Interface(notif,'org.freedesktop.Notifications');\nexcept:\n\tprint(0);\"";

        if (lPythonDbusPresent < 0 )
        {
           lPythonDbusPresent = 0 ;
                if ( python2Present() )
                {
                        strcpy(gPythonName , gPython2Name ) ;
                        sprintf( lPythonCommand , "%s %s" , gPythonName , lPythonParams ) ;
                        lPythonDbusPresent = tryCommand(lPythonCommand) ;
                }

                if ( !lPythonDbusPresent && python3Present() )
                {
                        strcpy(gPythonName , gPython3Name ) ;
                        sprintf( lPythonCommand , "%s %s" , gPythonName , lPythonParams ) ;
                        lPythonDbusPresent = tryCommand(lPythonCommand) ;
                }

                if (tinyfd_verbose) printf("lPythonDbusPresent %d\n", lPythonDbusPresent) ;
                if (tinyfd_verbose) printf("gPythonName %s\n", gPythonName) ;
        }
        return lPythonDbusPresent && graphicMode() && !(tfd_isDarwin() && getenv("SSH_TTY") );
}